

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

void armci_init_domains(MPI_Comm comm)

{
  bool bVar1;
  int iVar2;
  undefined4 *__ptr;
  int *__ptr_00;
  size_t sVar3;
  void *__ptr_01;
  undefined8 in_RDI;
  int *nodelist;
  int ncnt;
  int *nodesize;
  int *nodeid;
  int nprocs;
  int size;
  int rank;
  int namelen;
  char *prev_ptr;
  char *buf_ptr;
  char *namebuf;
  char name [256];
  int status;
  int i;
  int local_154;
  int local_13c;
  int local_138;
  int local_134;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 local_118 [32];
  comex_group_t *in_stack_ffffffffffffff08;
  comex_group_t in_stack_ffffffffffffff14;
  int *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int local_c;
  
  iVar2 = MPI_Comm_rank(in_RDI,&local_138);
  if (iVar2 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x22,"void armci_init_domains(MPI_Comm)");
  }
  iVar2 = MPI_Comm_size(in_RDI,&local_13c);
  if (iVar2 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x24,"void armci_init_domains(MPI_Comm)");
  }
  local_120 = (char *)malloc((long)(local_13c << 8));
  __ptr = (undefined4 *)malloc((long)local_13c << 2);
  __ptr_00 = (int *)malloc((long)local_13c << 2);
  MPI_Get_processor_name(local_118,&local_134);
  iVar2 = MPI_Allgather(local_118,0x100,&ompi_mpi_char,local_120,0x100,&ompi_mpi_char,in_RDI);
  if (iVar2 != 0) {
    __assert_fail("MPI_SUCCESS == status",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                  ,0x2d,"void armci_init_domains(MPI_Comm)");
  }
  local_154 = 0;
  *__ptr = 0;
  *__ptr_00 = 1;
  local_130 = local_120;
  local_128 = local_120;
  for (local_c = 1; local_128 = local_128 + 0x100, local_c < local_13c; local_c = local_c + 1) {
    sVar3 = strlen(local_128);
    local_134 = (int)sVar3;
    iVar2 = strncmp(local_130,local_128,(long)local_134);
    if (iVar2 != 0) {
      local_154 = local_154 + 1;
      __ptr_00[local_154] = 0;
    }
    __ptr[local_c] = local_154;
    __ptr_00[local_154] = __ptr_00[local_154] + 1;
    local_130 = local_130 + 0x100;
  }
  bVar1 = true;
  _number_of_procs_per_node = *__ptr_00;
  for (local_c = 1; local_c < local_154 + 1; local_c = local_c + 1) {
    if (__ptr_00[local_c] != _number_of_procs_per_node) {
      bVar1 = false;
    }
  }
  if (bVar1) {
    _my_node_id = local_138 / _number_of_procs_per_node;
  }
  else {
    _number_of_procs_per_node = 1;
    _my_node_id = local_138;
  }
  free(local_120);
  free(__ptr);
  free(__ptr_00);
  iVar2 = MPI_Barrier(in_RDI);
  if (iVar2 == 0) {
    if (1 < _number_of_procs_per_node) {
      __ptr_01 = malloc((long)_number_of_procs_per_node << 2);
      for (local_c = 0; local_c < _number_of_procs_per_node; local_c = local_c + 1) {
        *(int *)((long)__ptr_01 + (long)local_c * 4) =
             _my_node_id * _number_of_procs_per_node + local_c;
      }
      comex_group_create(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                         in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      free(__ptr_01);
    }
    return;
  }
  __assert_fail("MPI_SUCCESS == status",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/armci.c"
                ,0x56,"void armci_init_domains(MPI_Comm)");
}

Assistant:

void armci_init_domains(MPI_Comm comm)
{
  int i, status;
  char name[MPI_MAX_PROCESSOR_NAME];
  char *namebuf, *buf_ptr, *prev_ptr;
  int namelen, rank, size, nprocs;
  int *nodeid, *nodesize;
  int ncnt;

  status = MPI_Comm_rank(comm, &rank);
  assert(MPI_SUCCESS == status);
  status = MPI_Comm_size(comm, &size);
  assert(MPI_SUCCESS == status);

  /* determine number of processors per node. First find node name */
  namebuf = (char*)malloc(MPI_MAX_PROCESSOR_NAME*size*sizeof(char));
  nodeid = (int*)malloc(size*sizeof(int));
  nodesize = (int*)malloc(size*sizeof(int));
  MPI_Get_processor_name(name, &namelen);
  status = MPI_Allgather(name,MPI_MAX_PROCESSOR_NAME,MPI_CHAR,namebuf,
      MPI_MAX_PROCESSOR_NAME,MPI_CHAR,comm);
  assert(MPI_SUCCESS == status);

  /* Bin all processors with the same node name */
  ncnt = 0;
  nodeid[0] = ncnt;
  nodesize[0] = 1;
  prev_ptr = namebuf;
  buf_ptr = namebuf+MPI_MAX_PROCESSOR_NAME;
  for (i=1; i<size; i++) {
    namelen = strlen(buf_ptr);
    if (strncmp(prev_ptr,buf_ptr,namelen) != 0) {
      ncnt++;
      nodesize[ncnt]=0;
    }
    nodeid[i] = ncnt;
    nodesize[ncnt]++;
    prev_ptr += MPI_MAX_PROCESSOR_NAME;
    buf_ptr += MPI_MAX_PROCESSOR_NAME;
  }
  ncnt++;
  /* check to see if all nodes have the same number of processors */
  status = 1;
  nprocs = nodesize[0];
  for (i=1; i<ncnt; i++) {
    if (nodesize[i] != nprocs) status = 0;
  }
  /* uneven number of processors per node so bail out and assume each
   * processor is a node */
  if (!status) {
    _number_of_procs_per_node = 1;
    _my_node_id = rank;
  } else {
    /* Same number of processors for all nodes so set domain variables */
    _number_of_procs_per_node = nprocs;
    _my_node_id = rank/_number_of_procs_per_node;
  }

  free(namebuf);
  free(nodeid);
  free(nodesize);
  status = MPI_Barrier(comm);
  assert(MPI_SUCCESS == status);
  /* Create a comex group on the node */
  if (_number_of_procs_per_node > 1) {
    int *nodelist = (int*)malloc(_number_of_procs_per_node*sizeof(int));
    for (i=0; i<_number_of_procs_per_node; i++)
      nodelist[i] = _my_node_id*_number_of_procs_per_node+i;
    comex_group_create(_number_of_procs_per_node, nodelist,
        COMEX_GROUP_WORLD, &ARMCI_Node_group);
    free(nodelist);
  }
}